

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_details.cxx
# Opt level: O0

void __thiscall xray_re::xr_scene_details::save(xr_scene_details *this,xr_writer *w)

{
  xr_scene_revision *this_00;
  size_type sVar1;
  ulong uVar2;
  xr_writer *w_local;
  xr_scene_details *this_local;
  
  this_00 = xr_scene_part::revision(&this->super_xr_scene_part);
  xr_scene_revision::save(this_00,w);
  xr_writer::w_chunk<unsigned_int>(w,0x1000,&DETMGR_VERSION);
  xr_writer::w_chunk<unsigned_int>(w,0x1006,&this->m_flags);
  xr_writer::open_chunk(w,0);
  details_header::save(&this->m_header,w);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,1);
  xr_writer::
  w_chunks<std::vector<xray_re::detail_object*,std::allocator<xray_re::detail_object*>>,write_detail>
            (w,&this->m_objects);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,0x1003);
  sVar1 = std::vector<xray_re::color_index_*,_std::allocator<xray_re::color_index_*>_>::size
                    (&this->m_indices);
  xr_writer::w_size_u8(w,sVar1);
  xr_writer::
  w_seq<std::vector<xray_re::color_index*,std::allocator<xray_re::color_index*>>,write_color_index>
            (w,&this->m_indices);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,2);
  xr_writer::w_u32(w,this->m_num_slots);
  xr_writer::w_cseq<xray_re::detail_slot_v3>(w,(ulong)this->m_num_slots,this->m_slots);
  xr_writer::close_chunk(w);
  xr_writer::w_chunk<xray_re::_aabb<float>>(w,0x1001,&this->m_bbox);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    xr_writer::w_chunk(w,0x1002,&this->m_texture);
  }
  xr_writer::w_chunk<float>(w,0x1005,&this->m_density);
  xr_writer::open_chunk(w,0x1004);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->m_snap_objects);
  xr_writer::w_size_u32(w,sVar1);
  xr_writer::
  w_seq<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,xray_re::xr_writer::f_w_sz>
            (w,&this->m_snap_objects);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_scene_details::save(xr_writer& w) const
{
	revision().save(w);
	w.w_chunk<uint32_t>(DETMGR_CHUNK_VERSION, DETMGR_VERSION);
	w.w_chunk<uint32_t>(DETMGR_CHUNK_FLAGS, m_flags);

// this is ignored in LE
//	m_header.object_count = uint32_t(m_objects.size() & UINT32_MAX);
	w.open_chunk(DETMGR_CHUNK_HEADER);
	m_header.save(w);
	w.close_chunk();

	w.open_chunk(DETMGR_CHUNK_OBJECTS);
	w.w_chunks(m_objects, write_detail());
	w.close_chunk();

	w.open_chunk(DETMGR_CHUNK_COLOR_INDEX);
	w.w_size_u8(m_indices.size());
	w.w_seq(m_indices, write_color_index());
	w.close_chunk();

	w.open_chunk(DETMGR_CHUNK_SLOTS);
	w.w_u32(m_num_slots);
	w.w_cseq(m_num_slots, m_slots);
	w.close_chunk();

	w.w_chunk(DETMGR_CHUNK_BBOX, m_bbox);

	if (!m_texture.empty())
		w.w_chunk(DETMGR_CHUNK_TEXTURE, m_texture);

	w.w_chunk(DETMGR_CHUNK_DENSITY, m_density);

	w.open_chunk(DETMGR_CHUNK_SNAP_OBJECTS);
	w.w_size_u32(m_snap_objects.size());
	w.w_seq(m_snap_objects, xr_writer::f_w_sz());
	w.close_chunk();
}